

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O3

void __thiscall trompeloeil::sequence_handler<0UL>::retire_predecessors(sequence_handler<0UL> *this)

{
  sequence_matcher *psVar1;
  sequence_matcher *e;
  sequence_matcher *this_00;
  
  psVar1 = (this->matchers).
           super__Vector_base<trompeloeil::sequence_matcher,_std::allocator<trompeloeil::sequence_matcher>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (this->matchers).
                 super__Vector_base<trompeloeil::sequence_matcher,_std::allocator<trompeloeil::sequence_matcher>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != psVar1; this_00 = this_00 + 1
      ) {
    sequence_matcher::retire_predecessors(this_00);
  }
  return;
}

Assistant:

void reporter<T>::
    send(
      severity s,
      char const *file,
      unsigned long line,
      char const *msg)
    {
      reporter_obj()(s, file, line, msg);
    }